

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.cpp
# Opt level: O1

void __thiscall
WordSplitOnceTest_random_vector_Test<wchar_t>::TestBody
          (WordSplitOnceTest_random_vector_Test<wchar_t> *this)

{
  void *pvVar1;
  wchar_t in_R8D;
  char *pcVar2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  pair<std::vector<wchar_t,_std::allocator<wchar_t>_>,_std::vector<wchar_t,_std::allocator<wchar_t>_>_>
  split_result;
  RandomWordTestData<wchar_t,_std::vector<wchar_t,_std::allocator<wchar_t>_>_> data;
  AssertHelper aAStack_d8 [8];
  Message local_d0;
  undefined7 uStack_cf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  undefined1 local_c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  pointer local_b0;
  pair<std::vector<wchar_t,_std::allocator<wchar_t>_>,_std::vector<wchar_t,_std::allocator<wchar_t>_>_>
  local_a8;
  RandomWordTestData<wchar_t,_std::vector<wchar_t,_std::allocator<wchar_t>_>_> local_78;
  
  RandomWordTestData<wchar_t,_std::vector<wchar_t,_std::allocator<wchar_t>_>_>::RandomWordTestData
            (&local_78,L'\0',0,0);
  jessilib::
  word_split_once<std::vector<wchar_t,std::allocator<wchar_t>>,__gnu_cxx::__normal_iterator<wchar_t_const*,std::vector<wchar_t,std::allocator<wchar_t>>>,__gnu_cxx::__normal_iterator<wchar_t_const*,std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>
            (&local_a8,
             (jessilib *)
             local_78.m_str.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<const_wchar_t_*,_std::vector<wchar_t,_std::allocator<wchar_t>_>_>)
             local_78.m_str.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (__normal_iterator<const_wchar_t_*,_std::vector<wchar_t,_std::allocator<wchar_t>_>_>)
             0x0,in_R8D);
  testing::internal::
  CmpHelperEQ<std::vector<wchar_t,std::allocator<wchar_t>>,std::vector<wchar_t,std::allocator<wchar_t>>>
            ((internal *)local_c0,"split_result.first","data.m_tokens[0]",&local_a8.first,
             local_78.m_tokens.
             super__Vector_base<std::vector<wchar_t,_std::allocator<wchar_t>_>,_std::allocator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  if (local_c0[0] == (internal)0x0) {
    testing::Message::Message(&local_d0);
    if (local_b8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_b8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (aAStack_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
               ,0x91,pcVar2);
    testing::internal::AssertHelper::operator=(aAStack_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(aAStack_d8);
    if ((long *)CONCAT71(uStack_cf,local_d0) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(uStack_cf,local_d0) + 8))();
    }
  }
  if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b8,local_b8);
  }
  RandomWordTestData<wchar_t,_std::vector<wchar_t,_std::allocator<wchar_t>_>_>::get_remainder
            ((vector<wchar_t,_std::allocator<wchar_t>_> *)local_c0,&local_78,1);
  testing::internal::
  CmpHelperEQ<std::vector<wchar_t,std::allocator<wchar_t>>,std::vector<wchar_t,std::allocator<wchar_t>>>
            ((internal *)&local_d0,"split_result.second","data.get_remainder(1)",&local_a8.second,
             (vector<wchar_t,_std::allocator<wchar_t>_> *)local_c0);
  pvVar1 = (void *)CONCAT71(local_c0._1_7_,local_c0[0]);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_b0 - (long)pvVar1);
  }
  if (local_d0 == (Message)0x0) {
    testing::Message::Message((Message *)local_c0);
    if (local_c8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_c8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (aAStack_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
               ,0x92,pcVar2);
    testing::internal::AssertHelper::operator=(aAStack_d8,(Message *)local_c0);
    testing::internal::AssertHelper::~AssertHelper(aAStack_d8);
    if ((long *)CONCAT71(local_c0._1_7_,local_c0[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_c0._1_7_,local_c0[0]) + 8))();
    }
  }
  if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,local_c8);
  }
  if (local_a8.second.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.second.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.second.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.second.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a8.first.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.first.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.first.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.first.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78.m_token_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.m_token_indexes.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.m_token_indexes.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.m_token_indexes.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<wchar_t,_std::allocator<wchar_t>_>,_std::allocator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>_>
  ::~vector(&local_78.m_tokens);
  if ((jessilib *)
      local_78.m_str.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
      super__Vector_impl_data._M_start != (jessilib *)0x0) {
    operator_delete(local_78.m_str.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.m_str.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.m_str.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78.m_delim.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.m_delim.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.m_delim.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.m_delim.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TYPED_TEST(WordSplitOnceTest, random_vector) {
	using vector_type = std::vector<TypeParam>;
	RandomWordTestData<TypeParam, vector_type> data{};
	std::pair<vector_type, vector_type> split_result = word_split_once<vector_type>(data.m_str, default_delim<TypeParam>);

	EXPECT_EQ(split_result.first, data.m_tokens[0]);
	EXPECT_EQ(split_result.second, data.get_remainder(1));
}